

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

int insertkey(Table *t,TValue *key,TValue *value)

{
  long lVar1;
  long lVar2;
  lu_byte lVar3;
  lu_byte lVar4;
  undefined2 uVar5;
  int iVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  long lVar10;
  TValue *io2;
  TValue *io_;
  Node *unaff_R13;
  Node *pNVar11;
  TValue *io__1;
  Node *n_;
  Value local_38;
  lu_byte local_30;
  
  pNVar7 = mainpositionTV(t,key);
  if ((((pNVar7->u).tt_ & 0xf) != 0) || ((t->flags & 0x40) != 0)) {
    if (t->lsizenode < 3) {
      lVar10 = (1L << (t->lsizenode & 0x3f)) * 0x18 + -0x18;
      do {
        lVar1 = lVar10 + -0x18;
        pNVar11 = unaff_R13;
        if (lVar1 == -0x30) break;
        lVar2 = lVar10 + 9;
        pNVar11 = (Node *)((long)t->node + lVar10);
        lVar10 = lVar1;
      } while (*(char *)((long)t->node + lVar2) != '\0');
      if (lVar1 == -0x30) {
LAB_0011b35a:
        pNVar11 = (Node *)0x0;
      }
    }
    else {
      do {
        pNVar8 = t->node;
        pNVar9 = *(Node **)((long)pNVar8 - 8);
        if (pNVar9 <= pNVar8) goto LAB_0011b35a;
        pNVar11 = pNVar9 + -1;
        *(Node **)((long)pNVar8 - 8) = pNVar11;
      } while (*(char *)((long)pNVar9 - 0xf) != '\0');
    }
    if (pNVar11 != (Node *)0x0) {
      local_38 = (pNVar7->u).key_val;
      local_30 = (pNVar7->u).key_tt;
      pNVar8 = mainpositionTV(t,(TValue *)&local_38);
      if (pNVar8 == pNVar7) {
        if ((long)(pNVar7->u).next != 0) {
          (pNVar11->u).next =
               (int)((ulong)((long)pNVar7 + ((long)(pNVar7->u).next * 0x18 - (long)pNVar11)) >> 3) *
               -0x55555555;
        }
        (pNVar7->u).next = (int)((ulong)((long)pNVar11 - (long)pNVar7) >> 3) * -0x55555555;
        pNVar7 = pNVar11;
      }
      else {
        do {
          pNVar9 = pNVar8;
          pNVar8 = pNVar9 + (pNVar9->u).next;
        } while (pNVar9 + (pNVar9->u).next != pNVar7);
        (pNVar9->u).next = (int)((ulong)((long)pNVar11 - (long)pNVar9) >> 3) * -0x55555555;
        (pNVar11->u).key_val = (pNVar7->u).key_val;
        lVar3 = *(lu_byte *)((long)pNVar7 + 8);
        lVar4 = *(lu_byte *)((long)pNVar7 + 9);
        uVar5 = *(undefined2 *)((long)pNVar7 + 10);
        iVar6 = *(int *)((long)pNVar7 + 0xc);
        (pNVar11->u).value_ = (pNVar7->u).value_;
        *(lu_byte *)((long)pNVar11 + 8) = lVar3;
        *(lu_byte *)((long)pNVar11 + 9) = lVar4;
        *(undefined2 *)((long)pNVar11 + 10) = uVar5;
        *(int *)((long)pNVar11 + 0xc) = iVar6;
        if ((pNVar7->u).next != 0) {
          (pNVar11->u).next =
               (pNVar11->u).next + (int)((ulong)((long)pNVar7 - (long)pNVar11) >> 3) * -0x55555555;
          (pNVar7->u).next = 0;
        }
        (pNVar7->u).tt_ = '\x10';
      }
    }
    if (pNVar11 == (Node *)0x0) {
      return 0;
    }
  }
  (pNVar7->u).key_val = key->value_;
  (pNVar7->u).key_tt = key->tt_;
  (pNVar7->u).value_ = value->value_;
  (pNVar7->u).tt_ = value->tt_;
  return 1;
}

Assistant:

static int insertkey (Table *t, const TValue *key, TValue *value) {
  Node *mp = mainpositionTV(t, key);
  /* table cannot already contain the key */
  lua_assert(isabstkey(getgeneric(t, key, 0)));
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL)  /* cannot find a free place? */
      return 0;
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(mp, key);
  lua_assert(isempty(gval(mp)));
  setobj2t(cast(lua_State *, 0), gval(mp), value);
  return 1;
}